

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O0

Parg * __thiscall OB::Parg::usage(Parg *this,string *_usage)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *_usage_local;
  Parg *this_local;
  
  local_18 = _usage;
  _usage_local = (string *)this;
  std::operator+(&local_98,"  ",&this->name_);
  std::operator+(&local_78,&local_98," ");
  std::operator+(&local_58,&local_78,_usage);
  std::operator+(&local_38,&local_58,"\n");
  std::__cxx11::string::operator+=((string *)&this->usage_,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return this;
}

Assistant:

Parg& usage(std::string const _usage)
  {
    usage_ += "  " + name_ + " " + _usage + "\n";
    return *this;
  }